

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-fixed-contact-dynamical-system.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
IMUFixedContactDynamicalSystem(IMUFixedContactDynamicalSystem *this,double dt)

{
  Quaternion<double,_0> local_58;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_38 [2];
  double local_18;
  double dt_local;
  IMUFixedContactDynamicalSystem *this_local;
  
  local_18 = dt;
  dt_local = (double)this;
  DynamicalSystemFunctorBase::DynamicalSystemFunctorBase(&this->super_DynamicalSystemFunctorBase);
  algorithm::RigidBodyKinematics::RigidBodyKinematics((RigidBodyKinematics *)this);
  (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
       (_func_int **)&PTR__IMUFixedContactDynamicalSystem_006b3780;
  AccelerometerGyrometer::AccelerometerGyrometer(&this->sensor_);
  this->processNoise_ = (NoiseBase *)0x0;
  this->dt_ = local_18;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,2,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,2,3,1> *)&this->orientationVector_,local_38);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::Identity();
  Eigen::Quaternion<double,2>::Quaternion<double,0>
            ((Quaternion<double,2> *)&this->quaternion_,&local_58);
  this->measurementSize_ = 6;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&this->contactPositions_);
  return;
}

Assistant:

IMUFixedContactDynamicalSystem::
                    IMUFixedContactDynamicalSystem(double dt):
        processNoise_(0x0), dt_(dt),orientationVector_(Vector3::Zero()),
        quaternion_(Quaternion::Identity()),
        measurementSize_(measurementSizeBase_)
    {
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
     std::cout<<std::endl<<"IMUFixedContactDynamicalSystem Constructor"<<std::endl;
#endif //STATEOBSERVATION_VERBOUS_CONSTRUCTOR
    }